

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O3

char lejp_globals_cb(lejp_ctx *ctx,char reason)

{
  undefined8 *puVar1;
  uint8_t uVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  
  if ((reason & 0x40U) == 0) {
    return '\0';
  }
  uVar2 = ctx->path_match;
  if (uVar2 == '\0') {
    return '\0';
  }
  plVar3 = (long *)ctx->user;
  if (uVar2 == '\v' && reason == 'M') {
    lVar4 = plVar3[5];
    uVar7 = (ulong)((uint)lVar4 & 0xf);
    lVar8 = 0x10 - uVar7;
    if (uVar7 == 0) {
      lVar8 = 0;
    }
    *(byte *)((long)plVar3 + 0xdc) = *(byte *)((long)plVar3 + 0xdc) & 0xef;
    puVar1 = (undefined8 *)(lVar4 + lVar8);
    pcVar9 = (char *)(puVar1 + 4);
    plVar3[5] = (long)pcVar9;
    iVar6 = lejp_get_wildcard(ctx,0,pcVar9,(int)plVar3[6] - (int)pcVar9);
    lVar5 = *plVar3;
    *puVar1 = *(undefined8 *)(lVar5 + 0x108);
    *(long *)(lVar5 + 0x108) = lVar4 + lVar8;
    lVar4 = plVar3[5];
    puVar1[2] = lVar4;
    _lws_log(4,"  adding rej %s=%s\n",lVar4,ctx->buf);
    lVar4 = plVar3[5];
    plVar3[5] = lVar4 + iVar6;
    *(undefined1 *)(lVar4 + -1 + (long)iVar6) = 0;
    pcVar9 = (char *)plVar3[5];
    puVar1[3] = pcVar9;
    puVar1[1] = 0;
    goto LAB_0013bde0;
  }
  switch(uVar2) {
  case '\x01':
    iVar6 = atoi(ctx->buf);
    *(int *)(*plVar3 + 0x60) = iVar6;
    break;
  case '\x02':
    iVar6 = atoi(ctx->buf);
    *(int *)(*plVar3 + 0x5c) = iVar6;
    break;
  case '\x03':
    pcVar9 = (char *)plVar3[5];
    *(char **)(*plVar3 + 0x250) = pcVar9;
    goto LAB_0013bde0;
  case '\x04':
    pcVar9 = (char *)plVar3[5];
    *(char **)(*plVar3 + 600) = pcVar9;
    goto LAB_0013bde0;
  case '\x05':
    iVar6 = atoi(ctx->buf);
    *(int *)(*plVar3 + 0x94) = iVar6;
    break;
  case '\x06':
    iVar6 = arg_to_bool(ctx->buf);
    if (iVar6 != 0) {
      *(ulong *)(*plVar3 + 0x68) = *(ulong *)(*plVar3 + 0x68) | 0x1000;
    }
    break;
  case '\a':
    pcVar9 = (char *)plVar3[5];
    *(char **)(*plVar3 + 0xd8) = pcVar9;
    goto LAB_0013bde0;
  case '\b':
    iVar6 = (int)plVar3[0x1b];
    if ((long)iVar6 == 9) {
      _lws_log(1,"Too many plugin dirs\n");
      return -1;
    }
    pcVar9 = (char *)plVar3[5];
    *(int *)(plVar3 + 0x1b) = iVar6 + 1;
    *(char **)(plVar3[0x1a] + (long)iVar6 * 8) = pcVar9;
    goto LAB_0013bde0;
  case '\t':
    iVar6 = atoi(ctx->buf);
    *(short *)(*plVar3 + 0xf8) = (short)iVar6;
    break;
  case '\n':
    iVar6 = atoi(ctx->buf);
    *(int *)(*plVar3 + 0x9c) = iVar6;
    break;
  case '\r':
    pcVar9 = (char *)plVar3[5];
    *(char **)(*plVar3 + 0x1b0) = pcVar9;
LAB_0013bde0:
    iVar6 = lws_snprintf(pcVar9,plVar3[6] - (long)pcVar9,"%s",ctx->buf);
    lVar4 = plVar3[5];
    plVar3[5] = (long)((undefined1 *)(iVar6 + lVar4) + 1);
    *(undefined1 *)(iVar6 + lVar4) = 0;
    return '\0';
  case '\x0e':
    iVar6 = atoi(ctx->buf);
    *(short *)(*plVar3 + 0x188) = (short)iVar6;
    break;
  case '\x0f':
    iVar6 = atoi(ctx->buf);
    *(short *)(*plVar3 + 0x18a) = (short)iVar6;
  }
  return '\0';
}

Assistant:

static signed char
lejp_globals_cb(struct lejp_ctx *ctx, char reason)
{
	struct jpargs *a = (struct jpargs *)ctx->user;
	struct lws_protocol_vhost_options *rej;
	int n;

	/* we only match on the prepared path strings */
	if (!(reason & LEJP_FLAG_CB_IS_VALUE) || !ctx->path_match)
		return 0;

	/* this catches, eg, vhosts[].headers[].xxx */
	if (reason == LEJPCB_VAL_STR_END &&
	    ctx->path_match == LWJPGP_REJECT_SERVICE_KEYWORDS_NAME + 1) {
		rej = lwsws_align(a);
		a->p += sizeof(*rej);

		n = lejp_get_wildcard(ctx, 0, a->p, lws_ptr_diff(a->end, a->p));
		rej->next = a->info->reject_service_keywords;
		a->info->reject_service_keywords = rej;
		rej->name = a->p;
		 lwsl_notice("  adding rej %s=%s\n", a->p, ctx->buf);
		a->p += n - 1;
		*(a->p++) = '\0';
		rej->value = a->p;
		rej->options = NULL;
		goto dostring;
	}

	switch (ctx->path_match - 1) {
	case LEJPGP_UID:
		a->info->uid = atoi(ctx->buf);
		return 0;
	case LEJPGP_GID:
		a->info->gid = atoi(ctx->buf);
		return 0;
	case LEJPGP_USERNAME:
		a->info->username = a->p;
		break;
	case LEJPGP_GROUPNAME:
		a->info->groupname = a->p;
		break;
	case LEJPGP_COUNT_THREADS:
		a->info->count_threads = atoi(ctx->buf);
		return 0;
	case LWJPGP_INIT_SSL:
		if (arg_to_bool(ctx->buf))
			a->info->options |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
		return 0;
	case LEJPGP_SERVER_STRING:
#if defined(LWS_WITH_SERVER)
		a->info->server_string = a->p;
#endif
		break;
	case LEJPGP_PLUGIN_DIR:
		if (a->count_plugin_dirs == MAX_PLUGIN_DIRS - 1) {
			lwsl_err("Too many plugin dirs\n");
			return -1;
		}
		a->plugin_dirs[a->count_plugin_dirs++] = a->p;
		break;

	case LWJPGP_PINGPONG_SECS:
		a->info->ws_ping_pong_interval = atoi(ctx->buf);
		return 0;

	case LWJPGP_TIMEOUT_SECS:
		a->info->timeout_secs = atoi(ctx->buf);
		return 0;

	case LWJPGP_DEFAULT_ALPN:
		a->info->alpn = a->p;
		break;

	case LWJPGP_IP_LIMIT_AH:
		a->info->ip_limit_ah = atoi(ctx->buf);
		return 0;

	case LWJPGP_IP_LIMIT_WSI:
		a->info->ip_limit_wsi = atoi(ctx->buf);
		return 0;

	default:
		return 0;
	}

dostring:
	a->p += lws_snprintf(a->p, a->end - a->p, "%s", ctx->buf);
	*(a->p)++ = '\0';

	return 0;
}